

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2.c
# Opt level: O1

size_t ec2SubLD_deep(size_t n,size_t f_deep)

{
  size_t sVar1;
  
  sVar1 = utilMax(2,f_deep,n * 0x10 + f_deep);
  sVar1 = utilMax(2,f_deep,n * 0x30 + sVar1);
  return sVar1 + n * 0x18;
}

Assistant:

static size_t ec2SubLD_deep(size_t n, size_t f_deep)
{
	return O_OF_W(3 * n) +
		utilMax(2,
			f_deep,
			ec2AddLD_deep(n, f_deep));
}